

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

Real __thiscall NavierStokesBase::initialTimeStep(NavierStokesBase *this)

{
  ostringstream *this_00;
  double extraout_XMM0_Qa;
  char local_1a1;
  Real local_1a0;
  double local_198;
  Print local_190;
  
  local_1a0 = init_shrink;
  (*(this->super_AmrLevel)._vptr_AmrLevel[0x31])();
  local_198 = extraout_XMM0_Qa;
  local_190.os = amrex::OutStream();
  local_190.rank = *(int *)(DAT_00816950 + -0x30);
  this_00 = &local_190.ss;
  local_190.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  *(undefined8 *)(&local_190.field_0x18 + *(long *)(local_190._16_8_ + -0x18)) =
       *(undefined8 *)(local_190.os + *(long *)(*(long *)local_190.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Multiplying dt by init_shrink: dt = ",0x24);
  local_1a0 = local_1a0 * local_198;
  std::ostream::_M_insert<double>(local_1a0);
  local_1a1 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_1a1,1);
  amrex::Print::~Print(&local_190);
  return local_1a0;
}

Assistant:

Real
NavierStokesBase::initialTimeStep ()
{
    Real returnDt = init_shrink*estTimeStep();

    amrex::Print() << "Multiplying dt by init_shrink: dt = "
                   << returnDt << '\n';
    return returnDt;
}